

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

bool __thiscall QStyleSheetBorderData::isOpaque(QStyleSheetBorderData *this)

{
  BorderStyle BVar1;
  char cVar2;
  Representation *pRVar3;
  long lVar4;
  
  pRVar3 = &this->radii[0].ht;
  lVar4 = 0;
  do {
    BVar1 = this->styles[lVar4];
    if ((BVar1 != BorderStyle_None) && (BVar1 != BorderStyle_Native)) {
      if (BVar1 != BorderStyle_Solid && 0xfffffff9 < BVar1 - BorderStyle_Groove) {
        return false;
      }
      cVar2 = QBrush::isOpaque();
      if (cVar2 == '\0') {
        return false;
      }
      if ((0 < (((QSize *)(pRVar3 + -1))->wd).m_i) && (0 < pRVar3->m_i)) {
        return false;
      }
    }
    lVar4 = lVar4 + 1;
    pRVar3 = pRVar3 + 2;
    if (lVar4 == 4) {
      if (((this->bi).d.ptr != (QStyleSheetBorderImageData *)0x0) &&
         (cVar2 = QPixmap::hasAlpha(), cVar2 != '\0')) {
        return false;
      }
      return true;
    }
  } while( true );
}

Assistant:

bool isOpaque() const
    {
        for (int i = 0; i < 4; i++) {
            if (styles[i] == QCss::BorderStyle_Native || styles[i] == QCss::BorderStyle_None)
                continue;
            if (styles[i] >= QCss::BorderStyle_Dotted && styles[i] <= QCss::BorderStyle_DotDotDash
                && styles[i] != BorderStyle_Solid)
                return false;
            if (!colors[i].isOpaque())
                return false;
            if (!radii[i].isEmpty())
                return false;
        }
        if (bi != nullptr && bi->pixmap.hasAlpha())
            return false;
        return true;
    }